

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O0

void __thiscall
StringPrintf_FancyPctS_Test::StringPrintf_FancyPctS_Test(StringPrintf_FancyPctS_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__StringPrintf_FancyPctS_Test_037445f8;
  return;
}

Assistant:

TEST(StringPrintf, FancyPctS) {
    EXPECT_EQ(StringPrintf("%s", false), "false");
    EXPECT_EQ(StringPrintf("%s", true), "true");
    EXPECT_EQ(StringPrintf("%s", Vector3f(Pi, -2, 3.1)), "[ 3.1415927, -2, 3.1 ]");

    std::string s = "string";
    EXPECT_EQ(StringPrintf("%d %s", 1, s), "1 string");

    std::vector<int> v = {1, 2, 3, 4};
    EXPECT_EQ(StringPrintf("%s", v), "[ 1, 2, 3, 4 ]");

    std::array<std::string, 3> a = {"foo", "bar", "bat"};
    EXPECT_EQ(StringPrintf("%s", a), "[ foo, bar, bat ]");

    pstd::span<std::string> span(a);
    EXPECT_EQ(StringPrintf("%s", span), "[ foo, bar, bat ]");

    pstd::optional<float> pi = 3.125;
    EXPECT_EQ(StringPrintf("[ pstd::optional<%s> set: true value: 3.125 ]",
                           typeid(float).name()),
              StringPrintf("%s", pi));

    pstd::optional<float *> oe;
    EXPECT_EQ(StringPrintf("[ pstd::optional<%s> set: false value: n/a ]",
                           typeid(float *).name()),
              StringPrintf("%s", oe));
}